

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O0

ostream * pstore::repo::operator<<(ostream *os,linkage l)

{
  ostream *poVar1;
  char *local_20;
  char *str;
  linkage l_local;
  ostream *os_local;
  
  local_20 = "unknown";
  switch(l) {
  case internal_no_symbol:
    local_20 = "internal_no_symbol";
    break;
  case internal:
    local_20 = "internal";
    break;
  case append:
    local_20 = "append";
    break;
  case common:
    local_20 = "common";
    break;
  case external:
    local_20 = "external";
    break;
  case link_once_any:
    local_20 = "link_once_any";
    break;
  case link_once_odr:
    local_20 = "link_once_odr";
    break;
  case weak_any:
    local_20 = "weak_any";
    break;
  case weak_odr:
    local_20 = "weak_odr";
  }
  poVar1 = std::operator<<(os,local_20);
  return poVar1;
}

Assistant:

std::ostream & pstore::repo::operator<< (std::ostream & os, linkage const l) {
    char const * str = "unknown";
    switch (l) {
#define X(a)                                                                                       \
    case linkage::a: str = #a; break;
        PSTORE_REPO_LINKAGES
#undef X
    }
    return os << str;
}